

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O3

int io_file_write(lua_State *L,FILE *fp,int start)

{
  int iVar1;
  size_t sVar2;
  TValue *pTVar3;
  ulong __n;
  TValue *pTVar4;
  bool bVar5;
  
  pTVar3 = L->base + (uint)start;
  if (pTVar3 < L->top) {
    pTVar4 = L->base + (uint)start;
    bVar5 = true;
    do {
      if ((pTVar3->field_2).it == 0xfffffffb) {
        if (bVar5) {
          __n = (ulong)*(uint *)((ulong)(pTVar3->u32).lo + 0xc);
          sVar2 = fwrite((void *)((ulong)(pTVar3->u32).lo + 0x10),1,__n,(FILE *)fp);
          bVar5 = sVar2 == __n;
        }
        else {
LAB_00147667:
          bVar5 = false;
        }
      }
      else {
        if (0xfffefffe < (pTVar3->field_2).it) {
          lj_err_argt(L,(int)((ulong)((long)pTVar4 - (long)L->base) >> 3) + 1,4);
        }
        if (!bVar5) goto LAB_00147667;
        iVar1 = fprintf((FILE *)fp,"%.14g",pTVar3->u64);
        bVar5 = 0 < iVar1;
      }
      pTVar3 = pTVar3 + 1;
      pTVar4 = pTVar4 + 1;
    } while (pTVar3 < L->top);
    if (!bVar5) {
      iVar1 = luaL_fileresult(L,0,(char *)0x0);
      return iVar1;
    }
  }
  pTVar3 = L->base;
  L->top = pTVar3 + 1;
  if (start == 0) {
    (pTVar3->field_2).field_0 =
         *(anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
          ((ulong)(L->glref).ptr32 + 0x194);
    (pTVar3->field_2).it = 0xfffffff3;
  }
  return 1;
}

Assistant:

static int io_file_write(lua_State *L, FILE *fp, int start)
{
  cTValue *tv;
  int status = 1;
  for (tv = L->base+start; tv < L->top; tv++) {
    if (tvisstr(tv)) {
      MSize len = strV(tv)->len;
      status = status && (fwrite(strVdata(tv), 1, len, fp) == len);
    } else if (tvisint(tv)) {
      char buf[LJ_STR_INTBUF];
      char *p = lj_str_bufint(buf, intV(tv));
      size_t len = (size_t)(buf+LJ_STR_INTBUF-p);
      status = status && (fwrite(p, 1, len, fp) == len);
    } else if (tvisnum(tv)) {
      status = status && (fprintf(fp, LUA_NUMBER_FMT, numV(tv)) > 0);
    } else {
      lj_err_argt(L, (int)(tv - L->base) + 1, LUA_TSTRING);
    }
  }
  if (LJ_52 && status) {
    L->top = L->base+1;
    if (start == 0)
      setudataV(L, L->base, IOSTDF_UD(L, GCROOT_IO_OUTPUT));
    return 1;
  }
  return luaL_fileresult(L, status, NULL);
}